

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O1

int getLargestRec(int match,int *ids,int sx,int sz,Pos *p0,Pos *p1)

{
  int iVar1;
  bool bVar2;
  void *__ptr;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  int *piVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  iVar13 = sz;
  if (sz < sx) {
    iVar13 = sx;
  }
  __ptr = calloc((long)iVar13,0xc);
  if (sx < 1) {
    iVar13 = 0;
  }
  else {
    uVar9 = (ulong)(uint)sx;
    piVar8 = ids + uVar9;
    iVar11 = 0;
    iVar13 = 0;
    uVar10 = uVar9;
    do {
      piVar8 = piVar8 + -1;
      if (0 < sz) {
        lVar6 = 0;
        piVar7 = piVar8;
        do {
          iVar3 = 0;
          if (*piVar7 == match) {
            iVar3 = *(int *)((long)__ptr + lVar6) + 1;
          }
          *(int *)((long)__ptr + lVar6) = iVar3;
          piVar7 = piVar7 + uVar9;
          lVar6 = lVar6 + 0xc;
        } while ((ulong)(uint)sz * 0xc != lVar6);
      }
      if (0 < sz) {
        uVar5 = 0;
        iVar3 = 0;
        do {
          iVar1 = *(int *)((long)__ptr + uVar5 * 0xc);
          iVar4 = (int)uVar5;
          if (iVar3 < iVar1) {
            *(int *)((long)__ptr + (long)iVar11 * 0xc + 4) = iVar4;
            *(int *)((long)__ptr + (long)iVar11 * 0xc + 8) = iVar3;
            iVar11 = iVar11 + 1;
            iVar3 = iVar1;
          }
          if (iVar1 != iVar3) {
            lVar6 = (long)iVar11;
            piVar7 = (int *)((long)__ptr + lVar6 * 0xc + -4);
            do {
              iVar11 = piVar7[-1];
              iVar12 = (iVar4 - iVar11) * iVar3;
              if (iVar13 < iVar12) {
                p0->x = (int)(uVar10 - 1);
                p0->z = iVar11;
                p1->x = iVar3 + (int)uVar10 + -2;
                p1->z = iVar4 + -1;
                iVar13 = iVar12;
              }
              iVar3 = *piVar7;
              piVar7 = piVar7 + -3;
              lVar6 = lVar6 + -1;
            } while (iVar1 < iVar3);
            iVar3 = iVar1;
            iVar11 = (int)lVar6 + 1;
            if (iVar1 == 0) {
              iVar11 = (int)lVar6;
            }
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)sz);
      }
      bVar2 = 1 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar2);
  }
  free(__ptr);
  return iVar13;
}

Assistant:

int getLargestRec(int match, const int *ids, int sx, int sz, Pos *p0, Pos *p1)
{
    typedef struct { int n, j, w; } entry_t;
    entry_t *meta = (entry_t*) calloc(sx > sz ? sx : sz, sizeof(*meta));
    int i, j, w, m, ret;
    ret = m = 0;

    for (i = sx-1; i >= 0; i--)
    {
        for (j = 0; j < sz; j++)
        {
            if (ids[j*sx + i] == match)
                meta[j].n++;
            else
                meta[j].n = 0;
        }
        for (w = j = 0; j < sz; j++)
        {
            int n = meta[j].n;
            if (n > w)
            {
                meta[m].j = j;
                meta[m].w = w;
                m++;
                w = n;
            }
            if (n == w)
                continue;
            do
            {
                entry_t e = meta[--m];
                int area = w * (j - e.j);
                if (area > ret)
                {
                    p0->x = i; p0->z = e.j;
                    p1->x = i+w-1; p1->z = j-1;
                    ret = area;
                }
                w = e.w;
            }
            while (n < w);
            if ((w = n))
                m++;
        }
    }
    free(meta);
    return ret;
}